

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void art_replace(art_inner_node_t *node,art_typecode_t typecode,art_key_chunk_t key_chunk,
                art_ref_t new_child)

{
  art_inner_node_t *paVar1;
  undefined7 in_register_00000031;
  ulong uVar2;
  
  switch((int)CONCAT71(in_register_00000031,typecode)) {
  case 2:
    if ((ulong)node[1].prefix_size != 0) {
      paVar1 = (art_inner_node_t *)(node[2].prefix + 3);
      uVar2 = 0;
      do {
        if (node[1].prefix[uVar2] == key_chunk) goto LAB_0010540d;
        uVar2 = uVar2 + 1;
        paVar1 = (art_inner_node_t *)(paVar1[1].prefix + 1);
      } while (node[1].prefix_size != uVar2);
    }
    break;
  case 3:
    if ((ulong)node[1].prefix_size != 0) {
      paVar1 = node + 4;
      uVar2 = 0;
      do {
        if (node[1].prefix[uVar2] == key_chunk) goto LAB_0010540d;
        uVar2 = uVar2 + 1;
        paVar1 = (art_inner_node_t *)(paVar1[1].prefix + 1);
      } while (node[1].prefix_size != uVar2);
    }
    break;
  case 4:
    paVar1 = (art_inner_node_t *)
             ((long)node + (ulong)node[2].prefix[(ulong)key_chunk + 3] * 8 + 0x110);
    goto LAB_0010540d;
  case 5:
    paVar1 = (art_inner_node_t *)((long)node + (ulong)key_chunk * 8 + 8);
LAB_0010540d:
    *(art_ref_t *)paVar1 = new_child;
    return;
  }
  return;
}

Assistant:

static void art_replace(art_inner_node_t *node, art_typecode_t typecode,
                        art_key_chunk_t key_chunk, art_ref_t new_child) {
    switch (typecode) {
        case CROARING_ART_NODE4_TYPE:
            art_node4_replace((art_node4_t *)node, key_chunk, new_child);
            break;
        case CROARING_ART_NODE16_TYPE:
            art_node16_replace((art_node16_t *)node, key_chunk, new_child);
            break;
        case CROARING_ART_NODE48_TYPE:
            art_node48_replace((art_node48_t *)node, key_chunk, new_child);
            break;
        case CROARING_ART_NODE256_TYPE:
            art_node256_replace((art_node256_t *)node, key_chunk, new_child);
            break;
        default:
            assert(false);
    }
}